

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SwapOneofField<false>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  bool bVar1;
  uint32_t number;
  uint32_t uVar2;
  uint32_t uVar3;
  int32_t v;
  int v_00;
  FieldDescriptor *pFVar4;
  Message *v_01;
  uint64_t v_02;
  int64_t v_03;
  LogMessage *pLVar5;
  float fVar6;
  double v_04;
  MessageWrapper local_c0;
  MessageWrapper local_a8;
  FieldDescriptor *local_90;
  CppType local_84;
  string local_80;
  LocalVarWrapper temp;
  
  bVar1 = OneofDescriptor::is_synthetic(oneof_descriptor);
  if (bVar1) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&temp,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0x409,0x21,"!oneof_descriptor->is_synthetic()");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&temp);
  }
  number = GetOneofCase(this,lhs,oneof_descriptor);
  uVar2 = GetOneofCase(this,rhs,oneof_descriptor);
  temp.string_val._M_dataplus._M_p = (pointer)&temp.string_val.field_2;
  temp.string_val._M_string_length = 0;
  temp.string_val.field_2._M_local_buf[0] = '\0';
  if (number == 0) {
    local_90 = (FieldDescriptor *)0x0;
    goto LAB_0025213a;
  }
  local_a8.field = Descriptor::FindFieldByNumber(this->descriptor_,number);
  local_90 = local_a8.field;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(local_a8.field)->type_ * 4)) {
  case 1:
    local_a8.reflection = this;
    local_a8.message = lhs;
    uVar3 = SwapOneofField<false>::MessageWrapper::GetInt32(&local_a8);
    goto LAB_002520ca;
  case 2:
    local_a8.reflection = this;
    local_a8.message = lhs;
    temp.oneof_val.type_int64 = SwapOneofField<false>::MessageWrapper::GetInt64(&local_a8);
    break;
  case 3:
    local_a8.reflection = this;
    local_a8.message = lhs;
    uVar3 = SwapOneofField<false>::MessageWrapper::GetUint32(&local_a8);
    goto LAB_002520ca;
  case 4:
    local_a8.reflection = this;
    local_a8.message = lhs;
    temp.oneof_val.type_uint64 = SwapOneofField<false>::MessageWrapper::GetUint64(&local_a8);
    break;
  case 5:
    local_a8.reflection = this;
    local_a8.message = lhs;
    temp.oneof_val.type_double = SwapOneofField<false>::MessageWrapper::GetDouble(&local_a8);
    break;
  case 6:
    local_a8.reflection = this;
    local_a8.message = lhs;
    fVar6 = SwapOneofField<false>::MessageWrapper::GetFloat(&local_a8);
    temp.oneof_val.type_float = fVar6;
    break;
  case 7:
    local_a8.reflection = this;
    local_a8.message = lhs;
    bVar1 = SwapOneofField<false>::MessageWrapper::GetBool(&local_a8);
    temp.oneof_val.type_bool = bVar1;
    break;
  case 8:
    local_a8.reflection = this;
    local_a8.message = lhs;
    uVar3 = SwapOneofField<false>::MessageWrapper::GetEnum(&local_a8);
LAB_002520ca:
    temp.oneof_val.type_enum = uVar3;
    break;
  case 9:
    local_a8.reflection = this;
    local_a8.message = lhs;
    SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
    ::GetString_abi_cxx11_(&local_80,&local_a8);
    std::__cxx11::string::_M_assign((string *)&temp.string_val);
    std::__cxx11::string::~string((string *)&local_80);
    break;
  case 10:
    local_a8.reflection = this;
    local_a8.message = lhs;
    temp.oneof_val.type_message = SwapOneofField<false>::MessageWrapper::GetMessage(&local_a8);
    break;
  default:
    local_a8.reflection = this;
    local_a8.message = lhs;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0x23c);
    pLVar5 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       ((LogMessage *)&local_80,(char (*) [21])"unimplemented type: ");
    local_84 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_90->type_ * 4);
    absl::lts_20240722::log_internal::LogMessage::
    operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>(pLVar5,&local_84);
    goto LAB_002524f6;
  }
LAB_0025213a:
  if (uVar2 == 0) {
    ClearOneof(this,lhs,oneof_descriptor);
  }
  else {
    pFVar4 = Descriptor::FindFieldByNumber(this->descriptor_,uVar2);
    local_c0.field = pFVar4;
    local_a8.field = pFVar4;
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar4->type_ * 4)) {
    case 1:
      local_c0.reflection = this;
      local_c0.message = rhs;
      local_a8.reflection = this;
      local_a8.message = lhs;
      v = SwapOneofField<false>::MessageWrapper::GetInt32(&local_c0);
      SwapOneofField<false>::MessageWrapper::SetInt32(&local_a8,v);
      break;
    case 2:
      local_c0.reflection = this;
      local_c0.message = rhs;
      local_a8.reflection = this;
      local_a8.message = lhs;
      v_03 = SwapOneofField<false>::MessageWrapper::GetInt64(&local_c0);
      SwapOneofField<false>::MessageWrapper::SetInt64(&local_a8,v_03);
      break;
    case 3:
      local_c0.reflection = this;
      local_c0.message = rhs;
      local_a8.reflection = this;
      local_a8.message = lhs;
      uVar2 = SwapOneofField<false>::MessageWrapper::GetUint32(&local_c0);
      SwapOneofField<false>::MessageWrapper::SetUint32(&local_a8,uVar2);
      break;
    case 4:
      local_c0.reflection = this;
      local_c0.message = rhs;
      local_a8.reflection = this;
      local_a8.message = lhs;
      v_02 = SwapOneofField<false>::MessageWrapper::GetUint64(&local_c0);
      SwapOneofField<false>::MessageWrapper::SetUint64(&local_a8,v_02);
      break;
    case 5:
      local_c0.reflection = this;
      local_c0.message = rhs;
      local_a8.reflection = this;
      local_a8.message = lhs;
      v_04 = SwapOneofField<false>::MessageWrapper::GetDouble(&local_c0);
      SwapOneofField<false>::MessageWrapper::SetDouble(&local_a8,v_04);
      break;
    case 6:
      local_c0.reflection = this;
      local_c0.message = rhs;
      local_a8.reflection = this;
      local_a8.message = lhs;
      fVar6 = SwapOneofField<false>::MessageWrapper::GetFloat(&local_c0);
      SwapOneofField<false>::MessageWrapper::SetFloat(&local_a8,fVar6);
      break;
    case 7:
      local_c0.reflection = this;
      local_c0.message = rhs;
      local_a8.reflection = this;
      local_a8.message = lhs;
      bVar1 = SwapOneofField<false>::MessageWrapper::GetBool(&local_c0);
      SwapOneofField<false>::MessageWrapper::SetBool(&local_a8,bVar1);
      break;
    case 8:
      local_c0.reflection = this;
      local_c0.message = rhs;
      local_a8.reflection = this;
      local_a8.message = lhs;
      v_00 = SwapOneofField<false>::MessageWrapper::GetEnum(&local_c0);
      SwapOneofField<false>::MessageWrapper::SetEnum(&local_a8,v_00);
      break;
    case 9:
      local_c0.reflection = this;
      local_c0.message = rhs;
      local_a8.reflection = this;
      local_a8.message = lhs;
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::GetString_abi_cxx11_(&local_80,&local_c0);
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::string_const__(&local_a8,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      break;
    case 10:
      local_c0.reflection = this;
      local_c0.message = rhs;
      local_a8.reflection = this;
      local_a8.message = lhs;
      v_01 = SwapOneofField<false>::MessageWrapper::GetMessage(&local_c0);
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::Message__(&local_a8,v_01);
      break;
    default:
      local_c0.reflection = this;
      local_c0.message = rhs;
      local_a8.reflection = this;
      local_a8.message = lhs;
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x23c);
      pLVar5 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         ((LogMessage *)&local_80,(char (*) [21])"unimplemented type: ");
      local_84 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar4->type_ * 4);
      absl::lts_20240722::log_internal::LogMessage::
      operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>(pLVar5,&local_84);
      goto LAB_002524f6;
    }
  }
  if (number == 0) {
    ClearOneof(this,rhs,oneof_descriptor);
  }
  else {
    local_c0.field = local_90;
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_90->type_ * 4)) {
    case 1:
      local_c0.reflection = this;
      local_c0.message = rhs;
      SwapOneofField<false>::MessageWrapper::SetInt32(&local_c0,temp.oneof_val.type_int32);
      break;
    case 2:
      local_c0.reflection = this;
      local_c0.message = rhs;
      SwapOneofField<false>::MessageWrapper::SetInt64(&local_c0,temp.oneof_val.type_int64);
      break;
    case 3:
      local_c0.reflection = this;
      local_c0.message = rhs;
      SwapOneofField<false>::MessageWrapper::SetUint32(&local_c0,temp.oneof_val.type_uint32);
      break;
    case 4:
      local_c0.reflection = this;
      local_c0.message = rhs;
      SwapOneofField<false>::MessageWrapper::SetUint64(&local_c0,temp.oneof_val.type_uint64);
      break;
    case 5:
      local_c0.reflection = this;
      local_c0.message = rhs;
      SwapOneofField<false>::MessageWrapper::SetDouble(&local_c0,temp.oneof_val.type_double);
      break;
    case 6:
      local_c0.reflection = this;
      local_c0.message = rhs;
      SwapOneofField<false>::MessageWrapper::SetFloat(&local_c0,temp.oneof_val.type_float);
      break;
    case 7:
      local_c0.reflection = this;
      local_c0.message = rhs;
      SwapOneofField<false>::MessageWrapper::SetBool(&local_c0,temp.oneof_val.type_bool);
      break;
    case 8:
      local_c0.reflection = this;
      local_c0.message = rhs;
      SwapOneofField<false>::MessageWrapper::SetEnum(&local_c0,temp.oneof_val.type_enum);
      break;
    case 9:
      local_c0.reflection = this;
      local_c0.message = rhs;
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::string_const__(&local_c0,&temp.string_val);
      break;
    case 10:
      local_c0.reflection = this;
      local_c0.message = rhs;
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::Message__(&local_c0,temp.oneof_val.type_message);
      break;
    default:
      local_c0.reflection = this;
      local_c0.message = rhs;
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x23c);
      pLVar5 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         ((LogMessage *)&local_80,(char (*) [21])"unimplemented type: ");
      local_84 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_90->type_ * 4);
      absl::lts_20240722::log_internal::LogMessage::
      operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>(pLVar5,&local_84);
LAB_002524f6:
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_80);
    }
  }
  std::__cxx11::string::~string((string *)&temp.string_val);
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, var, name)               \
  type Get##name() const { return oneof_val.type_##var; } \
  void Set##name(type v) { oneof_val.type_##var = v; }

    LOCAL_VAR_ACCESSOR(int32_t, int32, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, int64, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, uint32, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, uint64, Uint64);
    LOCAL_VAR_ACCESSOR(float, float, Float);
    LOCAL_VAR_ACCESSOR(double, double, Double);
    LOCAL_VAR_ACCESSOR(bool, bool, Bool);
    LOCAL_VAR_ACCESSOR(int, enum, Enum);
    LOCAL_VAR_ACCESSOR(Message*, message, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    LOCAL_VAR_ACCESSOR(absl::Cord*, cord, Cord);
    const std::string& GetString() const { return string_val; }
    void SetString(const std::string& v) { string_val = v; }
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}

    union {
      int32_t type_int32;
      int64_t type_int64;
      uint32_t type_uint32;
      uint64_t type_uint64;
      float type_float;
      double type_double;
      bool type_bool;
      int type_enum;
      Message* type_message;
      internal::ArenaStringPtr type_arena_string_ptr;
      absl::Cord* type_cord;
    } oneof_val;

    // std::string cannot be in union.
    std::string string_val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, var, name)         \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, int32, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, int64, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, uint32, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, uint64, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, float, Float);
    MESSAGE_FIELD_ACCESSOR(double, double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, enum, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    MESSAGE_FIELD_ACCESSOR(absl::Cord*, cord, Cord);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  ABSL_DCHECK(!oneof_descriptor->is_synthetic());
  uint32_t oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32_t oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  OneofFieldMover<unsafe_shallow_swap> mover;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    mover(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    mover(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    mover(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}